

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astIfNode_primitiveCompileIntoBytecode
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t condition;
  sysbvm_tuple_t local_68;
  sysbvm_tuple_t sStack_60;
  sysbvm_tuple_t local_58;
  sysbvm_tuple_t sStack_50;
  sysbvm_tuple_t local_48;
  sysbvm_stackFrameRecord_t local_38;
  undefined8 local_28;
  undefined1 *local_20;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_58 = 0;
  sStack_50 = 0;
  local_68 = 0;
  sStack_60 = 0;
  local_48 = 0;
  local_38.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_38.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_38._12_4_ = 0;
  local_28 = 5;
  local_20 = (undefined1 *)&local_68;
  sysbvm_stackFrame_pushRecord(&local_38);
  local_68 = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);
  sStack_60 = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);
  condition = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                        (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],
                         *(sysbvm_tuple_t *)(*arguments + 0x28));
  sysbvm_functionBytecodeAssembler_jumpIfFalse
            (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),condition,
             local_68);
  local_48 = sysbvm_functionBytecodeAssembler_newTemporary
                       (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),
                        *(sysbvm_tuple_t *)(*arguments + 0x20));
  if (*(sysbvm_tuple_t *)(*arguments + 0x30) == 0) {
    local_58 = sysbvm_functionBytecodeAssembler_addLiteral
                         (context,((sysbvm_functionBytecodeDirectCompiler_t *)arguments[1])->
                                  assembler,0);
  }
  else {
    local_58 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                         (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],
                          *(sysbvm_tuple_t *)(*arguments + 0x30));
  }
  sysbvm_functionBytecodeAssembler_move
            (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),local_48,local_58
            );
  sysbvm_functionBytecodeAssembler_jump
            (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),sStack_60);
  sysbvm_functionBytecodeAssembler_addInstruction
            (*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),local_68);
  if (*(sysbvm_tuple_t *)(*arguments + 0x38) == 0) {
    sStack_50 = sysbvm_functionBytecodeAssembler_addLiteral
                          (context,((sysbvm_functionBytecodeDirectCompiler_t *)arguments[1])->
                                   assembler,0);
  }
  else {
    sStack_50 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                          (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],
                           *(sysbvm_tuple_t *)(*arguments + 0x38));
  }
  sysbvm_functionBytecodeAssembler_move
            (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),local_48,
             sStack_50);
  sysbvm_functionBytecodeAssembler_addInstruction
            (*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),sStack_60);
  return local_48;
}

Assistant:

static sysbvm_tuple_t sysbvm_astIfNode_primitiveCompileIntoBytecode(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_functionBytecodeDirectCompiler_t **compiler = (sysbvm_functionBytecodeDirectCompiler_t **)&arguments[1];

    sysbvm_astIfNode_t **ifNode = (sysbvm_astIfNode_t**)node;
    struct {
        sysbvm_tuple_t falseLabel;
        sysbvm_tuple_t mergeLabel;
        sysbvm_tuple_t trueResult;
        sysbvm_tuple_t falseResult;
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.falseLabel = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);
    gcFrame.mergeLabel = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);

    // Emit the condition
    {
        sysbvm_tuple_t condition = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*ifNode)->conditionExpression);
        sysbvm_functionBytecodeAssembler_jumpIfFalse(context, (*compiler)->assembler, condition, gcFrame.falseLabel);
    }

    gcFrame.result = sysbvm_functionBytecodeAssembler_newTemporary(context, (*compiler)->assembler, (*ifNode)->super.analyzedType);

    // True branch.
    if((*ifNode)->trueExpression)
        gcFrame.trueResult = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*ifNode)->trueExpression);
    else
        gcFrame.trueResult = sysbvm_functionBytecodeAssembler_addLiteral(context, (*compiler)->assembler, SYSBVM_NULL_TUPLE);
    sysbvm_functionBytecodeAssembler_move(context, (*compiler)->assembler, gcFrame.result, gcFrame.trueResult);
    sysbvm_functionBytecodeAssembler_jump(context, (*compiler)->assembler, gcFrame.mergeLabel);

    // False branch.
    sysbvm_functionBytecodeAssembler_addInstruction((*compiler)->assembler, gcFrame.falseLabel);
    if((*ifNode)->falseExpression)
        gcFrame.falseResult = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*ifNode)->falseExpression);
    else
        gcFrame.falseResult = sysbvm_functionBytecodeAssembler_addLiteral(context, (*compiler)->assembler, SYSBVM_NULL_TUPLE);
    sysbvm_functionBytecodeAssembler_move(context, (*compiler)->assembler, gcFrame.result, gcFrame.falseResult);

    sysbvm_functionBytecodeAssembler_addInstruction((*compiler)->assembler, gcFrame.mergeLabel);
    return gcFrame.result;
}